

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O0

bool __thiscall
HDD::Copy(HDD *this,HDD *phSrc_,int64_t uSectors_,int64_t uSrcOffset_,int64_t uDstOffset_,
         int64_t uTotal_,char *pcszAction_)

{
  int *piVar1;
  uint8_t *puVar2;
  int local_e0;
  char *local_c8;
  char *local_b0;
  long local_a8;
  int local_9c;
  char *pcStack_98;
  int uWritten;
  long local_90;
  int local_88;
  int local_84;
  int uRead;
  int local_64;
  int local_60;
  int local_5c;
  int iStack_58;
  int uBlock;
  int64_t uPos;
  MEMORY mem;
  int64_t uTotal__local;
  int64_t uDstOffset__local;
  int64_t uSrcOffset__local;
  int64_t uSectors__local;
  HDD *phSrc__local;
  HDD *this_local;
  
  mem.pb = (uint8_t *)uTotal_;
  MEMORY::MEMORY((MEMORY *)&uPos,this->sector_size << 0xb);
  if (mem.pb == (uint8_t *)0x0) {
    mem.pb = (uint8_t *)uSectors_;
  }
  _iStack_58 = 0;
  while( true ) {
    if (phSrc_ != (HDD *)0x0) {
      Seek(phSrc_,uSrcOffset_ + _iStack_58);
    }
    Seek(this,uDstOffset_ + _iStack_58);
    if (uSectors_ < _iStack_58) {
      _iStack_58 = uSectors_;
    }
    uSrcOffset__local._0_4_ = (int)uSectors_;
    local_60 = (int)uSrcOffset__local - iStack_58;
    local_64 = 0x800;
    piVar1 = std::min<int>(&local_60,&local_64);
    local_5c = *piVar1;
    if (pcszAction_ == (char *)0x0) {
      local_c8 = "Copying";
    }
    else {
      local_c8 = pcszAction_;
    }
    _uRead = local_c8;
    local_84 = (int)((ulong)((uDstOffset_ + _iStack_58) * 100) / (ulong)mem.pb);
    Message<char_const*,int>(msgStatus,"%s... %d%%",(char **)&uRead,&local_84);
    if (local_5c == 0) break;
    if (phSrc_ == (HDD *)0x0) {
      local_e0 = local_5c;
    }
    else {
      puVar2 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&uPos);
      local_e0 = Read(phSrc_,puVar2,local_5c,false);
    }
    local_88 = local_e0;
    if (local_e0 != local_5c) {
      local_90 = uSrcOffset_ + _iStack_58 + (long)local_e0;
      pcStack_98 = LastError();
      Message<long,char_const*>
                (msgStatus,"Read error at sector %lu: %s",&local_90,&stack0xffffffffffffff68);
      puVar2 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&uPos);
      memset(puVar2 + local_88 * this->sector_size,0,(long)this->sector_size);
      local_88 = local_88 + 1;
    }
    if (opt.byteswap != 0) {
      puVar2 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&uPos);
      ByteSwap(puVar2,(long)(local_88 * this->sector_size));
    }
    puVar2 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&uPos);
    local_9c = Write(this,puVar2,local_88,false);
    if (local_9c != local_88) {
      local_a8 = uDstOffset_ + _iStack_58 + (long)local_9c;
      local_b0 = LastError();
      Message<long,char_const*>(msgStatus,"Write error at sector %lu: %s",&local_a8,&local_b0);
      local_9c = local_9c + 1;
    }
    _iStack_58 = local_9c + _iStack_58;
  }
  MEMORY::~MEMORY((MEMORY *)&uPos);
  return true;
}

Assistant:

bool HDD::Copy(HDD* phSrc_, int64_t uSectors_, int64_t uSrcOffset_/*=0*/, int64_t uDstOffset_/*=0*/, int64_t uTotal_/*=0*/, const char* pcszAction_)
{
    MEMORY mem(SECTOR_BLOCK * sector_size);

    if (!uTotal_) uTotal_ = uSectors_;

    for (int64_t uPos = 0;;)
    {
        // Sync source and destinations
        if (phSrc_) phSrc_->Seek(uSrcOffset_ + uPos);
        Seek(uDstOffset_ + uPos);

        // Determine how much to transfer in one go
        if (uPos > uSectors_) uPos = uSectors_;
        auto uBlock = std::min(static_cast<int>(uSectors_ - uPos), SECTOR_BLOCK);

        Message(msgStatus, "%s... %d%%", pcszAction_ ? pcszAction_ : "Copying",
            static_cast<int>((static_cast<uint64_t>(uDstOffset_ + uPos) * 100 / uTotal_)));

        if (!uBlock)
            break;

        // Read from source disk
        auto uRead = phSrc_ ? phSrc_->Read(mem, uBlock) : uBlock;
        if (uRead != uBlock)
        {
            Message(msgStatus, "Read error at sector %lu: %s", uSrcOffset_ + uPos + uRead, LastError());

            // Clear the bad block, but include it in the read data
            memset(mem + (uRead * sector_size), 0, sector_size);
            ++uRead;
        }

        // Forced byte-swapping?
        if (opt.byteswap)
            ByteSwap(mem, uRead * sector_size);

        // Write to target disk
        auto uWritten = Write(mem, uRead);
        if (uWritten != uRead)
        {
            Message(msgStatus, "Write error at sector %lu: %s", uDstOffset_ + uPos + uWritten, LastError());

            // Skip past the write error
            ++uWritten;
        }

        // Advance by the amount written
        uPos += uWritten;
    }

    return true;
}